

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

JSON __thiscall
QPDFObjectHandle::getJSON(QPDFObjectHandle *this,int json_version,bool dereference_indirect)

{
  bool bVar1;
  logic_error *this_00;
  byte in_CL;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 in_register_00000034;
  __shared_ptr *this_01;
  JSON JVar3;
  string local_c0;
  undefined1 local_a0 [8];
  Writer jw;
  Pl_Buffer p;
  string local_40;
  byte local_1d;
  int local_1c;
  bool dereference_indirect_local;
  __shared_ptr *p_Stack_18;
  int json_version_local;
  QPDFObjectHandle *this_local;
  
  this_01 = (__shared_ptr *)CONCAT44(in_register_00000034,json_version);
  local_1c = (int)CONCAT71(in_register_00000011,dereference_indirect);
  local_1d = in_CL & 1;
  p_Stack_18 = this_01;
  this_local = this;
  if ((local_1d == 0) && (bVar1 = isIndirect((QPDFObjectHandle *)this_01), bVar1)) {
    unparse_abi_cxx11_(&local_40,(QPDFObjectHandle *)this_01);
    JSON::makeString((JSON *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_01);
    if (!bVar1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,"attempted to dereference an uninitialized QPDFObjectHandle");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    Pl_Buffer::Pl_Buffer((Pl_Buffer *)&jw.indent,"json",(Pipeline *)0x0);
    JSON::Writer::Writer((Writer *)local_a0,(Pipeline *)&jw.indent,0);
    writeJSON((QPDFObjectHandle *)this_01,local_1c,(Writer *)local_a0,(bool)(local_1d & 1));
    Pl_Buffer::finish((Pl_Buffer *)&jw.indent);
    Pl_Buffer::getString_abi_cxx11_(&local_c0,(Pl_Buffer *)&jw.indent);
    JSON::parse((JSON *)this,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&jw.indent);
    _Var2._M_pi = extraout_RDX_00;
  }
  JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
QPDFObjectHandle::getJSON(int json_version, bool dereference_indirect) const
{
    if ((!dereference_indirect) && isIndirect()) {
        return JSON::makeString(unparse());
    } else if (!obj) {
        throw std::logic_error("attempted to dereference an uninitialized QPDFObjectHandle");
    } else {
        Pl_Buffer p{"json"};
        JSON::Writer jw{&p, 0};
        writeJSON(json_version, jw, dereference_indirect);
        p.finish();
        return JSON::parse(p.getString());
    }
}